

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O3

int __thiscall re2c::Node::init(Node *this,EVP_PKEY_CTX *ctx)

{
  iterator iVar1;
  int iVar2;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar3;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *this_00;
  reference pvVar4;
  uint uVar5;
  long *in_RCX;
  long in_RDX;
  reference pvVar6;
  uint uVar7;
  uint uVar8;
  uint32_t ub;
  Node *n;
  uint local_54;
  pair<unsigned_int,_unsigned_int> local_50;
  arcsets_t *local_48;
  reference local_40;
  value_type local_38;
  
  if (in_RDX != 0) {
    (this->rule).rank.value = *(uint32_t *)(in_RDX + 0x40);
    iVar2 = (**(code **)(**(long **)(in_RDX + 0x38) + 0x20))();
    (this->rule).restorectx = iVar2 != 0;
  }
  this->ctx = SUB81(ctx,0);
  pvVar6 = (reference)*in_RCX;
  pvVar4 = (reference)in_RCX[1];
  if (pvVar6 != pvVar4) {
    local_48 = &this->arcsets;
    uVar8 = 0;
    local_40 = pvVar4;
    do {
      local_38 = *pvVar6;
      local_54 = pvVar6[1].first - 1;
      local_50.first = uVar8;
      uVar7 = local_54 - uVar8;
      if (uVar8 <= local_54 && uVar7 != 0) {
        do {
          pvVar3 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                   std::
                   map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[](&this->arcs,(key_type *)&local_38);
          iVar1._M_current = *(uint **)(pvVar3 + 8);
          if (iVar1._M_current == *(uint **)(pvVar3 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(pvVar3,iVar1,&local_50.first);
          }
          else {
            *iVar1._M_current = local_50.first;
            *(uint **)(pvVar3 + 8) = iVar1._M_current + 1;
          }
          uVar5 = local_50.first + (uVar7 >> 8) + 1;
          local_50.first = uVar5;
        } while (uVar5 < local_54);
      }
      pvVar3 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
               std::
               map<re2c::Node_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](&this->arcs,(key_type *)&local_38);
      iVar1._M_current = *(uint **)(pvVar3 + 8);
      if (iVar1._M_current == *(uint **)(pvVar3 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(pvVar3,iVar1,&local_54);
      }
      else {
        *iVar1._M_current = local_54;
        *(uint **)(pvVar3 + 8) = iVar1._M_current + 1;
      }
      this_00 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                 *)std::
                   map<re2c::Node_*,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::less<re2c::Node_*>,_std::allocator<std::pair<re2c::Node_*const,_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>_>
                   ::operator[](local_48,(key_type *)&local_38);
      local_50.second = local_54;
      local_50.first = uVar8;
      pvVar4 = std::
               vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
               ::emplace_back<std::pair<unsigned_int,unsigned_int>>(this_00,&local_50);
      uVar8 = local_54 + 1;
      pvVar6 = pvVar6 + 2;
    } while (pvVar6 != local_40);
  }
  return (int)pvVar4;
}

Assistant:

void Node::init(bool c, RuleOp *r, const std::vector<std::pair<Node*, uint32_t> > &a)
{
	if (r)
	{
		rule.rank = r->rank;
		rule.restorectx = r->ctx->fixedLength () != 0;
	}

	ctx = c;

	uint32_t lb = 0;
	std::vector<std::pair<Node*, uint32_t> >::const_iterator
		i = a.begin(),
		e = a.end();
	for (; i != e; ++i)
	{
		Node *n = i->first;
		const uint32_t ub = i->second - 1;

		// pick at most 0x100 unique edges from this range
		// (for 1-byte code units this covers the whole range: [0 - 0xFF])
		//   - range bounds must be included
		//   - values should be evenly distributed
		//   - values should be deterministic
		const uint32_t step = 1 + (ub - lb) / 0x100;
		for (uint32_t c = lb; c < ub; c += step)
		{
			arcs[n].push_back (c);
		}
		arcs[n].push_back (ub);

		arcsets[n].push_back (std::make_pair (lb, ub));
		lb = ub + 1;
	}
}